

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_db_instance_attribute.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c3853::Json2Array<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType>
::Json2Array(Json2Array<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType> *this,
            Value *value,
            vector<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType,_std::allocator<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType>_>
            *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_408 [8];
  RdsDescribeDBInstanceAttributeDBInstanceAttributeType val;
  int i;
  vector<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType,_std::allocator<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.connection_mode.field_2._12_4_ = 0; uVar1 = val.connection_mode.field_2._12_4_,
        AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val.connection_mode.field_2._12_4_ = val.connection_mode.field_2._12_4_ + 1) {
      aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType::
      RdsDescribeDBInstanceAttributeDBInstanceAttributeType
                ((RdsDescribeDBInstanceAttributeDBInstanceAttributeType *)local_408);
      value_00 = Json::Value::operator[](value,val.connection_mode.field_2._12_4_);
      anon_unknown.dwarf_c3853::Json2Type
                (value_00,(RdsDescribeDBInstanceAttributeDBInstanceAttributeType *)local_408);
      std::
      vector<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType,_std::allocator<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType>_>
      ::push_back(vec,(value_type *)local_408);
      aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType::
      ~RdsDescribeDBInstanceAttributeDBInstanceAttributeType
                ((RdsDescribeDBInstanceAttributeDBInstanceAttributeType *)local_408);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }